

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

int secp256k1_ge_is_in_correct_subgroup(secp256k1_ge *ge)

{
  uint uVar1;
  bool bVar2;
  secp256k1_gej out;
  secp256k1_gej sStack_b8;
  
  secp256k1_ge_verify(ge);
  secp256k1_gej_set_infinity(&sStack_b8);
  uVar1 = 0x1f;
  do {
    secp256k1_gej_double_var(&sStack_b8,&sStack_b8,(secp256k1_fe *)0x0);
    if ((0xdU >> (uVar1 & 0x1f) & 1) != 0) {
      secp256k1_gej_add_ge_var(&sStack_b8,&sStack_b8,ge,(secp256k1_fe *)0x0);
    }
    bVar2 = uVar1 != 0;
    uVar1 = uVar1 - 1;
  } while (bVar2);
  secp256k1_gej_verify(&sStack_b8);
  return sStack_b8.infinity;
}

Assistant:

static int secp256k1_ge_is_in_correct_subgroup(const secp256k1_ge* ge) {
#ifdef EXHAUSTIVE_TEST_ORDER
    secp256k1_gej out;
    int i;
    SECP256K1_GE_VERIFY(ge);

    /* A very simple EC multiplication ladder that avoids a dependency on ecmult. */
    secp256k1_gej_set_infinity(&out);
    for (i = 0; i < 32; ++i) {
        secp256k1_gej_double_var(&out, &out, NULL);
        if ((((uint32_t)EXHAUSTIVE_TEST_ORDER) >> (31 - i)) & 1) {
            secp256k1_gej_add_ge_var(&out, &out, ge, NULL);
        }
    }
    return secp256k1_gej_is_infinity(&out);
#else
    SECP256K1_GE_VERIFY(ge);

    (void)ge;
    /* The real secp256k1 group has cofactor 1, so the subgroup is the entire curve. */
    return 1;
#endif
}